

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_test.cc
# Opt level: O1

void CipherFileTest(FileTest *t)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Span<const_unsigned_char> iv_00;
  Span<const_unsigned_char> plaintext_00;
  Span<const_unsigned_char> ciphertext_00;
  Span<const_unsigned_char> aad_00;
  Span<const_unsigned_char> tag_00;
  bool bVar2;
  int iVar3;
  uint32_t uVar4;
  EVP_CIPHER *cipher;
  string *psVar5;
  Operation input_op;
  char *in_R9;
  pointer *__ptr;
  pointer *__ptr_1;
  Span<const_unsigned_char> key_00;
  AssertionResult gtest_ar__2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key;
  string cipher_str;
  vector<unsigned_char,_std::allocator<unsigned_char>_> iv;
  vector<unsigned_char,_std::allocator<unsigned_char>_> plaintext;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tag;
  vector<unsigned_char,_std::allocator<unsigned_char>_> aad;
  vector<unsigned_char,_std::allocator<unsigned_char>_> ciphertext;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_198;
  string local_190;
  AssertHelper local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_168;
  AssertHelper local_160;
  undefined1 local_158 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_150;
  pointer local_148;
  string local_138;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_118;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_f8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_d8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_b8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_98;
  uchar *local_80;
  size_t sStack_78;
  uchar *local_70;
  size_t sStack_68;
  uchar *local_60;
  size_t sStack_58;
  uchar *local_50;
  size_t sStack_48;
  long *local_40;
  size_t sStack_38;
  
  local_138._M_string_length = 0;
  local_138.field_2._M_local_buf[0] = '\0';
  paVar1 = &local_190.field_2;
  local_190._M_dataplus._M_p = (pointer)paVar1;
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"Cipher","");
  bVar2 = FileTest::GetAttribute(t,&local_138,&local_190);
  local_158[0] = (internal)bVar2;
  pbStack_150 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != paVar1) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  if (local_158[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_118);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_190,(internal *)local_158,
               (AssertionResult *)"t->GetAttribute(&cipher_str, \"Cipher\")","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
               ,0x1aa,local_190._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f8,(Message *)&local_118);
  }
  else {
    if (pbStack_150 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_150,pbStack_150);
    }
    iVar3 = std::__cxx11::string::compare((char *)&local_138);
    if (iVar3 == 0) {
      cipher = EVP_des_cbc();
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)&local_138);
      if (iVar3 == 0) {
        cipher = EVP_des_ecb();
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)&local_138);
        if (iVar3 == 0) {
          cipher = EVP_des_ede();
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)&local_138);
          if (iVar3 == 0) {
            cipher = EVP_des_ede3();
          }
          else {
            iVar3 = std::__cxx11::string::compare((char *)&local_138);
            if (iVar3 == 0) {
              cipher = EVP_des_ede_cbc();
            }
            else {
              iVar3 = std::__cxx11::string::compare((char *)&local_138);
              if (iVar3 == 0) {
                cipher = EVP_des_ede3_cbc();
              }
              else {
                iVar3 = std::__cxx11::string::compare((char *)&local_138);
                if (iVar3 == 0) {
                  cipher = EVP_rc4();
                }
                else {
                  iVar3 = std::__cxx11::string::compare((char *)&local_138);
                  if (iVar3 == 0) {
                    cipher = EVP_aes_128_ecb();
                  }
                  else {
                    iVar3 = std::__cxx11::string::compare((char *)&local_138);
                    if (iVar3 == 0) {
                      cipher = EVP_aes_256_ecb();
                    }
                    else {
                      iVar3 = std::__cxx11::string::compare((char *)&local_138);
                      if (iVar3 == 0) {
                        cipher = EVP_aes_128_cbc();
                      }
                      else {
                        iVar3 = std::__cxx11::string::compare((char *)&local_138);
                        if (iVar3 == 0) {
                          cipher = EVP_aes_128_gcm();
                        }
                        else {
                          iVar3 = std::__cxx11::string::compare((char *)&local_138);
                          if (iVar3 == 0) {
                            cipher = EVP_aes_128_ofb();
                          }
                          else {
                            iVar3 = std::__cxx11::string::compare((char *)&local_138);
                            if (iVar3 == 0) {
                              cipher = EVP_aes_192_cbc();
                            }
                            else {
                              iVar3 = std::__cxx11::string::compare((char *)&local_138);
                              if (iVar3 == 0) {
                                cipher = EVP_aes_192_ctr();
                              }
                              else {
                                iVar3 = std::__cxx11::string::compare((char *)&local_138);
                                if (iVar3 == 0) {
                                  cipher = EVP_aes_192_ecb();
                                }
                                else {
                                  iVar3 = std::__cxx11::string::compare((char *)&local_138);
                                  if (iVar3 == 0) {
                                    cipher = EVP_aes_192_gcm();
                                  }
                                  else {
                                    iVar3 = std::__cxx11::string::compare((char *)&local_138);
                                    if (iVar3 == 0) {
                                      cipher = EVP_aes_192_ofb();
                                    }
                                    else {
                                      iVar3 = std::__cxx11::string::compare((char *)&local_138);
                                      if (iVar3 == 0) {
                                        cipher = EVP_aes_256_cbc();
                                      }
                                      else {
                                        iVar3 = std::__cxx11::string::compare((char *)&local_138);
                                        if (iVar3 == 0) {
                                          cipher = EVP_aes_128_ctr();
                                        }
                                        else {
                                          iVar3 = std::__cxx11::string::compare((char *)&local_138);
                                          if (iVar3 == 0) {
                                            cipher = EVP_aes_256_ctr();
                                          }
                                          else {
                                            iVar3 = std::__cxx11::string::compare
                                                              ((char *)&local_138);
                                            if (iVar3 == 0) {
                                              cipher = EVP_aes_256_gcm();
                                            }
                                            else {
                                              iVar3 = std::__cxx11::string::compare
                                                                ((char *)&local_138);
                                              if (iVar3 == 0) {
                                                cipher = EVP_aes_256_ofb();
                                              }
                                              else {
                                                cipher = (EVP_CIPHER *)0x0;
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    local_158[0] = (internal)(cipher != (EVP_CIPHER *)0x0);
    pbStack_150 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (cipher != (EVP_CIPHER *)0x0) {
      local_148 = (pointer)0x0;
      local_158 = (undefined1  [8])0x0;
      pbStack_150 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (uchar *)0x0;
      local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (uchar *)0x0;
      local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (uchar *)0x0;
      local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (uchar *)0x0;
      local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_190._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"Key","");
      local_170.data_._0_1_ =
           (internal)
           FileTest::GetBytes(t,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_158,
                              &local_190);
      local_168 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != paVar1) {
        operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
      }
      if (local_170.data_._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_198);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_190,(internal *)&local_170,(AssertionResult *)"t->GetBytes(&key, \"Key\")"
                   ,"false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_160,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                   ,0x1af,local_190._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_198);
LAB_00240d5a:
        testing::internal::AssertHelper::~AssertHelper(&local_160);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != paVar1) {
          operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
        }
        if (local_198._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_198._M_head_impl + 8))();
        }
        if (local_168 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_168,local_168);
        }
      }
      else {
        if (local_168 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_168,local_168);
        }
        local_190._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"Plaintext","");
        local_170.data_._0_1_ = (internal)FileTest::GetBytes(t,&local_f8,&local_190);
        local_168 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != paVar1) {
          operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
        }
        if (local_170.data_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_198);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_190,(internal *)&local_170,
                     (AssertionResult *)"t->GetBytes(&plaintext, \"Plaintext\")","false","true",
                     in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_160,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                     ,0x1b0,local_190._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_198);
          goto LAB_00240d5a;
        }
        if (local_168 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_168,local_168);
        }
        local_190._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"Ciphertext","");
        local_170.data_._0_1_ = (internal)FileTest::GetBytes(t,&local_98,&local_190);
        local_168 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != paVar1) {
          operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
        }
        if (local_170.data_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_198);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_190,(internal *)&local_170,
                     (AssertionResult *)"t->GetBytes(&ciphertext, \"Ciphertext\")","false","true",
                     in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_160,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                     ,0x1b1,local_190._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_198);
          goto LAB_00240d5a;
        }
        if (local_168 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_168,local_168);
        }
        iVar3 = EVP_CIPHER_iv_length(cipher);
        if (iVar3 != 0) {
          local_190._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"IV","");
          local_170.data_._0_1_ = (internal)FileTest::GetBytes(t,&local_118,&local_190);
          local_168 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_dataplus._M_p != paVar1) {
            operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
          }
          if (local_170.data_._0_1_ == (internal)0x0) {
            testing::Message::Message((Message *)&local_198);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_190,(internal *)&local_170,
                       (AssertionResult *)"t->GetBytes(&iv, \"IV\")","false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_160,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                       ,0x1b3,local_190._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_198);
            goto LAB_00240d5a;
          }
          if (local_168 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_168,local_168);
          }
        }
        uVar4 = EVP_CIPHER_mode((EVP_CIPHER *)cipher);
        if (uVar4 == 6) {
          local_190._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"AAD","");
          local_170.data_._0_1_ = (internal)FileTest::GetBytes(t,&local_b8,&local_190);
          local_168 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_dataplus._M_p != paVar1) {
            operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
          }
          if (local_170.data_._0_1_ == (internal)0x0) {
            testing::Message::Message((Message *)&local_198);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_190,(internal *)&local_170,
                       (AssertionResult *)"t->GetBytes(&aad, \"AAD\")","false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_160,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                       ,0x1b6,local_190._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_198);
          }
          else {
            if (local_168 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_168,local_168);
            }
            local_190._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"Tag","");
            local_170.data_._0_1_ = (internal)FileTest::GetBytes(t,&local_d8,&local_190);
            local_168 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_190._M_dataplus._M_p != paVar1) {
              operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_170.data_._0_1_ != (internal)0x0) {
              if (local_168 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_168,local_168);
              }
              goto LAB_0024088c;
            }
            testing::Message::Message((Message *)&local_198);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_190,(internal *)&local_170,
                       (AssertionResult *)"t->GetBytes(&tag, \"Tag\")","false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_160,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                       ,0x1b7,local_190._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_198);
          }
          goto LAB_00240d5a;
        }
LAB_0024088c:
        local_190._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"Operation","");
        bVar2 = FileTest::HasAttribute(t,&local_190);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != paVar1) {
          operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
        }
        input_op = kBoth;
        if (bVar2) {
          local_190._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"Operation","");
          psVar5 = FileTest::GetAttributeOrDie(t,&local_190);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_dataplus._M_p != paVar1) {
            operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
          }
          iVar3 = std::__cxx11::string::compare((char *)psVar5);
          input_op = kEncrypt;
          bVar2 = true;
          if ((iVar3 != 0) && (iVar3 = std::__cxx11::string::compare((char *)psVar5), iVar3 != 0)) {
            iVar3 = std::__cxx11::string::compare((char *)psVar5);
            input_op = kDecrypt;
            if ((iVar3 != 0) && (iVar3 = std::__cxx11::string::compare((char *)psVar5), iVar3 != 0))
            {
              iVar3 = std::__cxx11::string::compare((char *)psVar5);
              if (iVar3 == 0) {
                input_op = kInvalidDecrypt;
              }
              else {
                testing::Message::Message((Message *)&local_190);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_190._M_dataplus._M_p + 0x10),"Unknown operation: ",0x13
                          );
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_190._M_dataplus._M_p + 0x10),(psVar5->_M_dataplus)._M_p
                           ,psVar5->_M_string_length);
                testing::internal::AssertHelper::AssertHelper
                          (&local_170,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                           ,0x1c4,"Failed");
                testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_190);
                testing::internal::AssertHelper::~AssertHelper(&local_170);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_190._M_dataplus._M_p !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  (**(code **)(*(size_type *)local_190._M_dataplus._M_p + 8))();
                }
                bVar2 = false;
                input_op = kBoth;
              }
            }
          }
          if (bVar2) goto LAB_00240e8e;
        }
        else {
LAB_00240e8e:
          key_00.size_ = (long)pbStack_150 - (long)local_158;
          local_40 = (long *)local_118.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start;
          sStack_38 = (long)local_118.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)local_118.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start;
          local_50 = local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          sStack_48 = (long)local_f8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)local_f8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start;
          local_60 = local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          sStack_58 = (long)local_98.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)local_98.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start;
          local_70 = local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          sStack_68 = (long)local_b8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)local_b8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start;
          local_80 = local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          sStack_78 = (long)local_d8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)local_d8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start;
          iv_00.size_ = sStack_38;
          iv_00.data_ = local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start;
          plaintext_00.size_ = sStack_48;
          plaintext_00.data_ =
               local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
          ciphertext_00.size_ = sStack_58;
          ciphertext_00.data_ =
               local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
          aad_00.size_ = sStack_68;
          aad_00.data_ = local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start;
          tag_00.size_ = sStack_78;
          tag_00.data_ = local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start;
          key_00.data_ = (uchar *)local_158;
          TestCipher((EVP_CIPHER *)cipher,input_op,false,key_00,iv_00,plaintext_00,ciphertext_00,
                     aad_00,tag_00);
        }
      }
      if (local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (uchar *)0x0) {
        operator_delete(local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_d8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_d8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (uchar *)0x0) {
        operator_delete(local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_b8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_b8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (uchar *)0x0) {
        operator_delete(local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_98.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_98.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (uchar *)0x0) {
        operator_delete(local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_f8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_f8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((long *)local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start != (long *)0x0) {
        operator_delete(local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_118.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_118.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_158 != (undefined1  [8])0x0) {
        operator_delete((void *)local_158,(long)local_148 - (long)local_158);
      }
      goto LAB_00240e51;
    }
    testing::Message::Message((Message *)&local_118);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_190,(internal *)local_158,(AssertionResult *)0x5453a9,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
               ,0x1ac,local_190._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f8,(Message *)&local_118);
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != paVar1) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  if ((long *)local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (long *)0x0) {
    (**(code **)(*(long *)local_118.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start + 8))();
  }
  if (pbStack_150 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_150,pbStack_150);
  }
LAB_00240e51:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,
                    CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                             local_138.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

static void CipherFileTest(FileTest *t) {
  std::string cipher_str;
  ASSERT_TRUE(t->GetAttribute(&cipher_str, "Cipher"));
  const EVP_CIPHER *cipher = GetCipher(cipher_str);
  ASSERT_TRUE(cipher);

  std::vector<uint8_t> key, iv, plaintext, ciphertext, aad, tag;
  ASSERT_TRUE(t->GetBytes(&key, "Key"));
  ASSERT_TRUE(t->GetBytes(&plaintext, "Plaintext"));
  ASSERT_TRUE(t->GetBytes(&ciphertext, "Ciphertext"));
  if (EVP_CIPHER_iv_length(cipher) > 0) {
    ASSERT_TRUE(t->GetBytes(&iv, "IV"));
  }
  if (EVP_CIPHER_mode(cipher) == EVP_CIPH_GCM_MODE) {
    ASSERT_TRUE(t->GetBytes(&aad, "AAD"));
    ASSERT_TRUE(t->GetBytes(&tag, "Tag"));
  }

  Operation op = Operation::kBoth;
  if (t->HasAttribute("Operation")) {
    const std::string &str = t->GetAttributeOrDie("Operation");
    if (str == "Encrypt" || str == "ENCRYPT") {
      op = Operation::kEncrypt;
    } else if (str == "Decrypt" || str == "DECRYPT") {
      op = Operation::kDecrypt;
    } else if (str == "InvalidDecrypt") {
      op = Operation::kInvalidDecrypt;
    } else {
      FAIL() << "Unknown operation: " << str;
    }
  }

  TestCipher(cipher, op, /*padding=*/false, key, iv, plaintext, ciphertext, aad,
             tag);
}